

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O0

int kputc(int c,kstring_t *s)

{
  size_t sVar1;
  char *pcVar2;
  char *tmp;
  kstring_t *s_local;
  int c_local;
  
  if (s->m <= s->l + 1) {
    s->m = s->l + 2;
    s->m = s->m - 1;
    s->m = s->m >> 1 | s->m;
    s->m = s->m >> 2 | s->m;
    s->m = s->m >> 4 | s->m;
    s->m = s->m >> 8 | s->m;
    s->m = s->m >> 0x10 | s->m;
    s->m = s->m + 1;
    pcVar2 = (char *)realloc(s->s,s->m);
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    s->s = pcVar2;
  }
  sVar1 = s->l;
  s->l = sVar1 + 1;
  s->s[sVar1] = (char)c;
  s->s[s->l] = '\0';
  return c;
}

Assistant:

static inline int kputc(int c, kstring_t *s)
{
	if (s->l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	s->s[s->l++] = c;
	s->s[s->l] = 0;
	return c;
}